

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O0

bool launch(QString *launcher,QUrl *url,QString *xdgActivationToken)

{
  bool bVar1;
  char *pcVar2;
  QStringView *in_RDX;
  QStringBuilder<const_QString_&,_char16_t> *in_RSI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> QVar3;
  QStringView QVar4;
  bool ok;
  QProcessEnvironment env;
  QProcess process;
  QString program;
  QStringList args;
  QString command;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  char16_t *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  byte bVar5;
  QStringBuilder<const_QString_&,_char16_t> *this;
  char local_1a0 [56];
  undefined1 local_168 [24];
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  storage_type_conflict *local_120;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char local_e0 [36];
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_bc;
  undefined1 local_b8 [40];
  QString *local_90;
  char16_t local_88;
  undefined2 local_7a;
  QString local_78;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  QString *local_38;
  char16_t local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_7a = 0x20;
  QVar3 = operator+((QString *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                    in_stack_fffffffffffffe20);
  local_90 = QVar3.a;
  local_88 = QVar3.b;
  this = in_RSI;
  local_38 = local_90;
  local_30 = local_88;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
            (&local_bc,FullyEncoded);
  QUrl::toEncoded((QUrlTwoFlags *)local_b8);
  QLatin1String::QLatin1String
            ((QLatin1String *)in_RDX,
             (QByteArray *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  operator+(in_RSI,(QLatin1String *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QLatin1String> *)
             CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  QByteArray::~QByteArray((QByteArray *)0xacbfbd);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = 0xaa;
  uStack_3f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcQpaServices();
  anon_unknown.dwarf_1d508dd::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RSI,
             (QLoggingCategory *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_48), bVar1) {
    anon_unknown.dwarf_1d508dd::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xacc013);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDX,
               (char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
               (int)((ulong)in_RSI >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
               (char *)0xacc02c);
    QtPrivate::asString(&local_78);
    QString::toLocal8Bit((QString *)this);
    pcVar2 = QByteArray::constData((QByteArray *)0xacc056);
    QMessageLogger::debug(local_e0,"Launching %s",pcVar2);
    QByteArray::~QByteArray((QByteArray *)0xacc07c);
    local_40 = 0;
  }
  local_110 = &DAT_aaaaaaaaaaaaaaaa;
  local_108 = &DAT_aaaaaaaaaaaaaaaa;
  local_100 = &DAT_aaaaaaaaaaaaaaaa;
  QStringView::QStringView<QString,_true>
            (in_RDX,(QString *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  QVar4.m_data = local_120;
  QVar4.m_size = (qsizetype)&local_110;
  QProcess::splitCommand(QVar4);
  bVar5 = 0;
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0xacc0fa);
  if (!bVar1) {
    local_138 = &DAT_aaaaaaaaaaaaaaaa;
    local_130 = &DAT_aaaaaaaaaaaaaaaa;
    local_128 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::takeFirst((QList<QString> *)this);
    local_148 = &DAT_aaaaaaaaaaaaaaaa;
    local_140 = &DAT_aaaaaaaaaaaaaaaa;
    QProcess::QProcess((QProcess *)&local_148,(QObject *)0x0);
    QProcess::setProgram((QString *)&local_148);
    QProcess::setArguments((QList_conflict3 *)&local_148);
    bVar1 = QString::isEmpty((QString *)0xacc1a7);
    if (!bVar1) {
      local_150 = &DAT_aaaaaaaaaaaaaaaa;
      QProcessEnvironment::systemEnvironment();
      Qt::Literals::StringLiterals::operator____s((char16_t *)this,(size_t)in_RDX);
      QProcessEnvironment::insert((QString *)&local_150,(QString *)local_168);
      QString::~QString((QString *)0xacc20b);
      QProcessEnvironment::toStringList();
      QProcess::setEnvironment((QList_conflict3 *)&local_148);
      QList<QString>::~QList((QList<QString> *)0xacc239);
      QProcessEnvironment::~QProcessEnvironment((QProcessEnvironment *)&local_150);
    }
    bVar5 = QProcess::startDetached((longlong *)&local_148);
    bVar5 = bVar5 & 1;
    QProcess::~QProcess((QProcess *)&local_148);
    QString::~QString((QString *)0xacc277);
  }
  if ((bVar5 & 1) == 0) {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcQpaServices();
    anon_unknown.dwarf_1d508dd::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_RSI,
               (QLoggingCategory *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_58), bVar1) {
      anon_unknown.dwarf_1d508dd::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0xacc2d5);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDX,(char *)CONCAT17(bVar5,in_stack_fffffffffffffe28),
                 (int)((ulong)in_RSI >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                 (char *)0xacc2eb);
      QtPrivate::asString(&local_78);
      QString::toLocal8Bit((QString *)this);
      pcVar2 = QByteArray::constData((QByteArray *)0xacc30f);
      QMessageLogger::warning(local_1a0,"Launch failed (%s)",pcVar2);
      QByteArray::~QByteArray((QByteArray *)0xacc32f);
      local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
    }
  }
  QList<QString>::~QList((QList<QString> *)0xacc353);
  QString::~QString((QString *)0xacc360);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar5 & 1);
}

Assistant:

static inline bool launch(const QString &launcher, const QUrl &url,
                          const QString &xdgActivationToken)
{

    const QString command = launcher + u' ' + QLatin1StringView(url.toEncoded());
    qCDebug(lcQpaServices, "Launching %s", qPrintable(command));
#if !QT_CONFIG(process)
    if (!xdgActivationToken.isEmpty())
        qputenv("XDG_ACTIVATION_TOKEN", xdgActivationToken.toUtf8());
    const bool ok = ::system(qPrintable(command + " &"_L1));
    if (!xdgActivationToken.isEmpty())
        qunsetenv("XDG_ACTIVATION_TOKEN");
#  else
    QStringList args = QProcess::splitCommand(command);
    bool ok = false;
    if (!args.isEmpty()) {
        QString program = args.takeFirst();
        QProcess process;
        process.setProgram(program);
        process.setArguments(args);

        if (!xdgActivationToken.isEmpty()) {
            auto env = QProcessEnvironment::systemEnvironment();
            env.insert(u"XDG_ACTIVATION_TOKEN"_s, xdgActivationToken);
            process.setEnvironment(env.toStringList());
        }
        ok = process.startDetached(nullptr);
    }
#  endif
    if (!ok)
        qCWarning(lcQpaServices, "Launch failed (%s)", qPrintable(command));

    return ok;
}